

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_UrlQueryEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  int iVar15;
  char *pcVar16;
  TemplateString local_350;
  TemplateString local_330;
  TemplateString local_310;
  TemplateString local_2f0;
  TemplateString local_2d0;
  TemplateString local_2b0;
  TemplateString local_290;
  TemplateDictionaryPeer local_270;
  TemplateDictionaryPeer peer;
  size_t sStack_260;
  undefined8 local_258;
  TemplateId TStack_250;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"TestUrlQueryEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"query escape 0");
  ctemplate::TemplateString::TemplateString(&local_e8,"");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar8.length_ = local_e8.length_;
  TVar8.ptr_ = local_e8.ptr_;
  TVar8.is_immutable_ = local_e8.is_immutable_;
  TVar8._17_7_ = local_e8._17_7_;
  TVar8.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar8,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_108,"query escape 1");
  ctemplate::TemplateString::TemplateString(&local_128,"noop");
  TVar2.length_ = local_108.length_;
  TVar2.ptr_ = local_108.ptr_;
  TVar2.is_immutable_ = local_108.is_immutable_;
  TVar2._17_7_ = local_108._17_7_;
  TVar2.id_ = local_108.id_;
  TVar9.length_ = local_128.length_;
  TVar9.ptr_ = local_128.ptr_;
  TVar9.is_immutable_ = local_128.is_immutable_;
  TVar9._17_7_ = local_128._17_7_;
  TVar9.id_ = local_128.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar9,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_148,"query escape 2");
  ctemplate::TemplateString::TemplateString
            (&local_168,"0123456789abcdefghjijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),")
  ;
  TVar3.length_ = local_148.length_;
  TVar3.ptr_ = local_148.ptr_;
  TVar3.is_immutable_ = local_148.is_immutable_;
  TVar3._17_7_ = local_148._17_7_;
  TVar3.id_ = local_148.id_;
  TVar10.length_ = local_168.length_;
  TVar10.ptr_ = local_168.ptr_;
  TVar10.is_immutable_ = local_168.is_immutable_;
  TVar10._17_7_ = local_168._17_7_;
  TVar10.id_ = local_168.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar10,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_188,"query escape 3");
  ctemplate::TemplateString::TemplateString(&local_1a8," ?a=b;c#d ");
  TVar4.length_ = local_188.length_;
  TVar4.ptr_ = local_188.ptr_;
  TVar4.is_immutable_ = local_188.is_immutable_;
  TVar4._17_7_ = local_188._17_7_;
  TVar4.id_ = local_188.id_;
  TVar11.length_ = local_1a8.length_;
  TVar11.ptr_ = local_1a8.ptr_;
  TVar11.is_immutable_ = local_1a8.is_immutable_;
  TVar11._17_7_ = local_1a8._17_7_;
  TVar11.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar11,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_1c8,"query escape 4");
  ctemplate::TemplateString::TemplateString(&local_1e8,"#$%&+<=>?@[\\]^`{|}");
  TVar5.length_ = local_1c8.length_;
  TVar5.ptr_ = local_1c8.ptr_;
  TVar5.is_immutable_ = local_1c8.is_immutable_;
  TVar5._17_7_ = local_1c8._17_7_;
  TVar5.id_ = local_1c8.id_;
  TVar12.length_ = local_1e8.length_;
  TVar12.ptr_ = local_1e8.ptr_;
  TVar12.is_immutable_ = local_1e8.is_immutable_;
  TVar12._17_7_ = local_1e8._17_7_;
  TVar12.id_ = local_1e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar12,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_208,"query escape 5");
  ctemplate::TemplateString::TemplateString(&local_228,anon_var_dwarf_3f70);
  TVar6.length_ = local_208.length_;
  TVar6.ptr_ = local_208.ptr_;
  TVar6.is_immutable_ = local_208.is_immutable_;
  TVar6._17_7_ = local_208._17_7_;
  TVar6.id_ = local_208.id_;
  TVar13.length_ = local_228.length_;
  TVar13.ptr_ = local_228.ptr_;
  TVar13.is_immutable_ = local_228.is_immutable_;
  TVar13._17_7_ = local_228._17_7_;
  TVar13.id_ = local_228.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar13,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_248,"query escape 6");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"\"\':");
  TVar7.length_ = local_248.length_;
  TVar7.ptr_ = local_248.ptr_;
  TVar7.is_immutable_ = local_248.is_immutable_;
  TVar7._17_7_ = local_248._17_7_;
  TVar7.id_ = local_248.id_;
  TVar14.length_ = sStack_260;
  TVar14.ptr_ = (char *)peer.dict_;
  TVar14._16_8_ = local_258;
  TVar14.id_ = TStack_250;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar14,(TemplateModifier *)local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_270,local_78);
  ctemplate::TemplateString::TemplateString(&local_290,"query escape 0");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_290);
  iVar15 = strcmp(pcVar16,"");
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"query escape 0\"), \"\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2b0,"query escape 1");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2b0);
  iVar15 = strcmp(pcVar16,"noop");
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"query escape 1\"), \"noop\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2d0,"query escape 2");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2d0);
  iVar15 = strcmp(pcVar16,
                  "0123456789abcdefghjijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),");
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"query escape 2\"), \"0123456789abcdefghjijklmnopqrstuvwxyz\" \"ABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2f0,"query escape 3");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2f0);
  iVar15 = strcmp(pcVar16,"+%3Fa%3Db%3Bc%23d+");
  if (iVar15 == 0) {
    ctemplate::TemplateString::TemplateString(&local_310,"query escape 4");
    pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_310);
    iVar15 = strcmp(pcVar16,"%23%24%25%26%2B%3C%3D%3E%3F%40%5B%5C%5D%5E%60%7B%7C%7D");
    if (iVar15 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"query escape 4\"), \"%23%24%25%26%2B%3C%3D%3E%3F%40%5B%5C%5D%5E%60%7B%7C%7D\") == 0"
             );
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_330,"query escape 5");
    pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_330);
    iVar15 = strcmp(pcVar16,"%DE%AD%CA%FE");
    if (iVar15 == 0) {
      ctemplate::TemplateString::TemplateString(&local_350,"query escape 6");
      pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_350);
      iVar15 = strcmp(pcVar16,"%22%27%3A");
      if (iVar15 == 0) {
        ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
        return;
      }
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"query escape 6\"), \"%22%27%3A\") == 0");
      exit(1);
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"query escape 5\"), \"%DE%AD%CA%FE\") == 0");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"query escape 3\"), \"+%3Fa%3Db%3Bc%23d+\") == 0");
  exit(1);
}

Assistant:

TEST(TemplateModifiers, UrlQueryEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestUrlQueryEscape", NULL);
  // The first three tests do not need escaping.
  dict.SetEscapedValue("query escape 0", "",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 1", "noop",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 2",
                       "0123456789abcdefghjijklmnopqrstuvwxyz"
                       "ABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 3", " ?a=b;c#d ",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 4", "#$%&+<=>?@[\\]^`{|}",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 5", "\xDE\xAD\xCA\xFE",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 6", "\"':",
                       GOOGLE_NAMESPACE::url_query_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("query escape 0"), "");
  EXPECT_STREQ(peer.GetSectionValue("query escape 1"), "noop");
  EXPECT_STREQ(peer.GetSectionValue("query escape 2"),
               "0123456789abcdefghjijklmnopqrstuvwxyz"
               "ABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),");
  EXPECT_STREQ(peer.GetSectionValue("query escape 3"), "+%3Fa%3Db%3Bc%23d+");
  EXPECT_STREQ(peer.GetSectionValue("query escape 4"),
               "%23%24%25%26%2B%3C%3D%3E%3F%40%5B%5C%5D%5E%60%7B%7C%7D");
  EXPECT_STREQ(peer.GetSectionValue("query escape 5"), "%DE%AD%CA%FE");
  EXPECT_STREQ(peer.GetSectionValue("query escape 6"), "%22%27%3A");
}